

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

MemRefOpnd * IR::MemRefOpnd::New(intptr_t pMemLoc,IRType type,Func *func,AddrOpndKind addrOpndKind)

{
  undefined1 *puVar1;
  MemRefOpnd *pMVar2;
  
  pMVar2 = (MemRefOpnd *)new<Memory::JitArenaAllocator>(0x20,func->m_alloc,0x3eba5c);
  (pMVar2->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (pMVar2->super_Opnd).m_type = TyIllegal;
  (pMVar2->super_Opnd).field_0xb = 0;
  (pMVar2->super_Opnd).m_kind = OpndKindInvalid;
  (pMVar2->super_Opnd).isDeleted = false;
  *(undefined2 *)&(pMVar2->super_Opnd).field_0xe = 0;
  pMVar2->m_memLoc = 0;
  *(undefined8 *)&pMVar2->m_addrKind = 0;
  (pMVar2->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014d8690;
  ValueType::ValueType(&(pMVar2->super_Opnd).m_valueType);
  puVar1 = &(pMVar2->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 8;
  (pMVar2->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014d8790;
  pMVar2->m_memLoc = pMemLoc;
  (pMVar2->super_Opnd).m_type = type;
  (pMVar2->super_Opnd).m_kind = OpndKindMemRef;
  (pMVar2->super_Opnd).isDeleted = false;
  pMVar2->m_addrKind = addrOpndKind;
  return pMVar2;
}

Assistant:

MemRefOpnd *
MemRefOpnd::New(intptr_t pMemLoc, IRType type, Func *func, AddrOpndKind addrOpndKind)
{
    MemRefOpnd * memRefOpnd = JitAnew(func->m_alloc, IR::MemRefOpnd);
    memRefOpnd->m_memLoc = pMemLoc;
    memRefOpnd->m_type = type;

    memRefOpnd->m_kind = OpndKindMemRef;
#if DBG_DUMP
    memRefOpnd->m_addrKind = addrOpndKind;
#endif

    return memRefOpnd;
}